

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

void __thiscall Reducer::loadWorking(Reducer *this)

{
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *this_00;
  pointer pcVar1;
  Builder *pBVar2;
  Module *pMVar3;
  Builder *pBVar4;
  pointer __p;
  __uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> local_208 [49];
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  undefined2 local_3c [2];
  undefined4 local_38;
  ModuleReader reader;
  
  pMVar3 = (Module *)operator_new(0x348);
  memset(pMVar3,0,0x348);
  wasm::Module::Module(pMVar3);
  this_00 = &this->module;
  local_208[0]._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (tuple<wasm::Module_*,_std::default_delete<wasm::Module>_>)
       (_Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>)0x0;
  std::__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>::reset
            ((__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_> *)this_00,pMVar3);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_208);
  local_38 = 0;
  reader.super_ModuleIOBase.debugInfo = false;
  local_3c[0] = 1;
  pcVar1 = (this->working)._M_dataplus._M_p;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (this->working)._M_string_length);
  pMVar3 = (this_00->_M_t).super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  wasm::ModuleReader::read(local_3c,local_80,pMVar3,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  pMVar3 = (this_00->_M_t).super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  if (pMVar3->hasFeaturesSection == false) {
    (pMVar3->features).features = 0x1efff;
  }
  wasm::ToolOptions::applyFeatures(this->toolOptions,pMVar3);
  pMVar3 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  pBVar4 = (Builder *)operator_new(8);
  pBVar4->wasm = pMVar3;
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = pBVar4;
  if (pBVar2 != (Builder *)0x0) {
    operator_delete(pBVar2,8);
    pMVar3 = (this_00->_M_t).super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
             super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  }
  (this->
  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>).
  super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule = pMVar3;
  return;
}

Assistant:

void loadWorking() {
    module = std::make_unique<Module>();
    ModuleReader reader;
    try {
      reader.read(working, *module);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      std::cerr << '\n';
      Fatal() << "error in parsing working wasm binary";
    }

    // If there is no features section, assume we may need them all (without
    // this, a module with no features section but that uses e.g. atomics and
    // bulk memory would not work).
    if (!module->hasFeaturesSection) {
      module->features = FeatureSet::All;
    }
    // Apply features the user passed on the commandline.
    toolOptions.applyFeatures(*module);

    builder = std::make_unique<Builder>(*module);
    setModule(module.get());
  }